

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCallIndirectExpr
          (ExprVisitorDelegate *this,CallIndirectExpr *expr)

{
  WatWriter *this_00;
  Index index;
  char *s;
  undefined1 local_68 [8];
  Var type_var;
  CallIndirectExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  this_00 = this->writer_;
  type_var.field_2._24_8_ = expr;
  s = Opcode::GetName((Opcode *)&Opcode::CallIndirect_Opcode);
  WritePutsSpace(this_00,s);
  WriteVarUnlessZero(this->writer_,(Var *)(type_var.field_2._24_8_ + 0xc0),Space);
  WriteOpenSpace(this->writer_,"type");
  if ((*(byte *)(type_var.field_2._24_8_ + 0x40) & 1) == 0) {
    index = Module::GetFuncTypeIndex
                      ((this->writer_->super_ModuleContext).module,
                       (FuncDeclaration *)(type_var.field_2._24_8_ + 0x40));
    Var::Var((Var *)local_68,index,(Location *)(type_var.field_2._24_8_ + 0x18));
  }
  else {
    Var::Var((Var *)local_68,(Var *)(type_var.field_2._24_8_ + 0x48));
  }
  WriteVar(this->writer_,(Var *)local_68,Newline);
  WriteCloseNewline(this->writer_);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  Var::~Var((Var *)local_68);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCallIndirectExpr(
    CallIndirectExpr* expr) {
  writer_->WritePutsSpace(Opcode::CallIndirect_Opcode.GetName());
  writer_->WriteVarUnlessZero(expr->table, NextChar::Space);
  writer_->WriteOpenSpace("type");
  const auto type_var =
      expr->decl.has_func_type
          ? expr->decl.type_var
          : Var{writer_->module.GetFuncTypeIndex(expr->decl), expr->loc};
  writer_->WriteVar(type_var, NextChar::Newline);
  writer_->WriteCloseNewline();
  return Result::Ok;
}